

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::chooseColumn(HDual *this,HVector *row_ep)

{
  HVector *this_00;
  HDualRow *this_01;
  uint uVar1;
  pointer pdVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (this->invertHint != 0) {
    return;
  }
  uVar3 = rdtsc();
  uVar7 = (undefined4)((ulong)uVar3 >> 0x20);
  auVar5._4_4_ = uVar7;
  auVar5._0_4_ = uVar7;
  auVar5._8_4_ = 0;
  auVar14._0_12_ = auVar5 << 0x20;
  auVar14._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0x12] =
       (auVar14._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  this_00 = &this->row_ap;
  HVector::clear(this_00);
  HMatrix::price_by_row(this->matrix,this_00,row_ep);
  HTimer::recordFinish(&this->model->timer,0x12);
  uVar3 = rdtsc();
  uVar7 = (undefined4)((ulong)uVar3 >> 0x20);
  auVar6._4_4_ = uVar7;
  auVar6._0_4_ = uVar7;
  auVar6._8_4_ = 0;
  auVar12._0_12_ = auVar6 << 0x20;
  auVar12._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0xc] =
       (auVar12._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  this_01 = &this->dualRow;
  HDualRow::clear(this_01);
  (this->dualRow).workDelta = this->deltaPrimal;
  HDualRow::create_Freemove(this_01,row_ep);
  HDualRow::choose_makepack(this_01,this_00,0);
  HDualRow::choose_makepack(this_01,row_ep,this->numCol);
  HDualRow::choose_possible(this_01);
  HTimer::recordFinish(&this->model->timer,0xc);
  this->columnIn = -1;
  if (((this->dualRow).workTheta <= 0.0) || ((this->dualRow).workCount == 0)) {
    this->invertHint = 5;
  }
  else {
    HDualRow::choose_final(this_01);
    HDualRow::delete_Freemove(this_01);
    this->columnIn = (this->dualRow).workPivot;
    this->alphaRow = (this->dualRow).workAlpha;
    this->thetaDual = (this->dualRow).workTheta;
    if (this->EdWt_Mode == 1) {
      pdVar2 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar17 = pdVar2[this->rowOut];
      uVar1 = (this->dualRow).packCount;
      uVar11 = 0;
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar10 = uVar11;
      }
      dVar15 = 0.0;
      for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
        dVar16 = (double)(this->dvx_ix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(this->dualRow).packIndex.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar11]] *
                 (this->dualRow).packValue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11];
        dVar15 = dVar15 + dVar16 * dVar16;
      }
      if (dVar15 <= 1.0) {
        dVar15 = 1.0;
      }
      auVar13._8_8_ = dVar15;
      auVar13._0_8_ = dVar17;
      auVar4._8_8_ = dVar17;
      auVar4._0_8_ = dVar15;
      auVar14 = divpd(auVar13,auVar4);
      iVar8 = (int)((double)this->numRow / 0.01);
      iVar9 = 0x19;
      if (0x19 < iVar8) {
        iVar9 = iVar8;
      }
      dVar17 = auVar14._8_8_;
      if (auVar14._8_8_ <= auVar14._0_8_) {
        dVar17 = auVar14._0_8_;
      }
      this->nw_dvx_fwk = iVar9 < this->n_dvx_it || 9.0 < dVar17;
      pdVar2[this->rowOut] = dVar15;
    }
  }
  return;
}

Assistant:

void HDual::chooseColumn(HVector *row_ep) {

	if (invertHint)
		return;

	// Compute pivot row
	model->timer.recordStart(HTICK_PRICE);
	row_ap.clear();
	matrix->price_by_row(row_ap, *row_ep);
	model->timer.recordFinish(HTICK_PRICE);

	// Choose column - possible
	model->timer.recordStart(HTICK_CHUZC1);
	dualRow.clear();
	dualRow.workDelta = deltaPrimal;
	dualRow.create_Freemove(row_ep);
	dualRow.choose_makepack(&row_ap, 0);
	dualRow.choose_makepack(row_ep, numCol);
	dualRow.choose_possible();
	model->timer.recordFinish(HTICK_CHUZC1);

	// Choose column - check problem
	columnIn = -1;
	if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
   	  invertHint = invertHint_possiblyDualUnbounded; // Was 1
		return;
	}

	// Choose column - final
	dualRow.choose_final();
	dualRow.delete_Freemove();

	columnIn = dualRow.workPivot;
	alphaRow = dualRow.workAlpha;
	thetaDual = dualRow.workTheta;

	if (rp_hsol && rowOut >= 0) {
		printf("\nPvR: Row %2d\n", rowOut);
		dualRow.rp_hsol_pv_r();
	}
	if (EdWt_Mode == EdWt_Mode_Dvx) {
		//
		//Determine the exact Devex weight
		//
//    	int dvx_ix_o_columnIn = dvx_ix[columnIn];
//    	int si_it_n = model->numberIteration;
		double og_dvx_wt_o_rowOut = dualRHS.workEdWt[rowOut];
		int vr_t_lv_bs = model->getBaseIndex()[rowOut];
		int dvx_ix_o_vr_t_lv_bs = dvx_ix[vr_t_lv_bs];
		if (vr_t_lv_bs < numCol) {
//    		Structural leaving the basis
			if (rp_dvx)
				printf("\n DvxIt %d; RowOut %d; VrOut %d Str: DvxIx %d\n",
						n_dvx_it, rowOut, vr_t_lv_bs, dvx_ix_o_vr_t_lv_bs);
		} else {
//    		Logical leaving the basis
			if (rp_dvx)
				printf("\n DvxIt %d; RowOut %d; VrOut %d  Lg: DvxIx %d\n",
						n_dvx_it, rowOut, vr_t_lv_bs, dvx_ix_o_vr_t_lv_bs);
		}
		double tru_dvx_wt_o_rowOut = 0;
		//    	Have to loop over [row_ap; row_ep]
		for (int el_n = 0; el_n < dualRow.packCount; el_n++) {
			int vr_n = dualRow.packIndex[el_n];
			double pv = dvx_ix[vr_n] * dualRow.packValue[el_n];
			tru_dvx_wt_o_rowOut += pv * pv;
		}
		if (rp_dvx)
			printf("Sum of squares for Devex weight = %g\n",
					tru_dvx_wt_o_rowOut);
		tru_dvx_wt_o_rowOut = max(1.0, tru_dvx_wt_o_rowOut);
		if (rp_dvx)
			printf("tru_dvx_wt_o_rowOut = %g; alphaRow = %g\n",
					tru_dvx_wt_o_rowOut, alphaRow);
		//Analyse the Devex weight to determine whether a new framework should be set up
		double dvx_rao = max(og_dvx_wt_o_rowOut / tru_dvx_wt_o_rowOut,
				tru_dvx_wt_o_rowOut / og_dvx_wt_o_rowOut);
		int i_te = numRow / nw_dvx_fwk_fq;
		if (rp_dvx)
			printf("i_te = %d; %d: dvx_rao = %8.2g\n", i_te,
					max(mn_n_dvx_it, i_te), dvx_rao);
		i_te = max(mn_n_dvx_it, i_te);
//		Square tl_dvx_wt due to keeping squared weights
		nw_dvx_fwk = dvx_rao > tl_dvx_wt * tl_dvx_wt || n_dvx_it > i_te;
		if (nw_dvx_fwk)
			if (rp_dvx)
				printf("!!NEW DEVEX FRAMEWORK!!\n");
		dualRHS.workEdWt[rowOut] = tru_dvx_wt_o_rowOut;
	}

}